

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void write_pic_parameter_set_rbsp(h264_stream_t *h,bs_t *b)

{
  pps_t *ppVar1;
  uint uVar2;
  byte *pbVar3;
  int iVar4;
  int *useDefaultScalingMatrixFlag;
  uint uVar5;
  ulong uVar6;
  uint32_t uVar7;
  int (*scalingList) [16];
  int iVar8;
  int (*paiVar9) [16];
  int (*paiVar10) [16];
  long lVar11;
  int *piVar12;
  bool bVar13;
  
  ppVar1 = h->pps;
  bs_write_ue(b,ppVar1->pic_parameter_set_id);
  bs_write_ue(b,ppVar1->seq_parameter_set_id);
  uVar2 = ppVar1->entropy_coding_mode_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar3 = b->p;
  if (pbVar3 < b->end) {
    *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | (byte)((uVar2 & 1) << ((byte)b->bits_left & 0x1f));
    iVar4 = b->bits_left;
    pbVar3 = b->p;
  }
  if (iVar4 == 0) {
    pbVar3 = pbVar3 + 1;
    b->p = pbVar3;
    iVar4 = 8;
  }
  uVar2 = ppVar1->pic_order_present_flag;
  iVar4 = iVar4 + -1;
  b->bits_left = iVar4;
  if (pbVar3 < b->end) {
    *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | (byte)((uVar2 & 1) << ((byte)b->bits_left & 0x1f));
    iVar4 = b->bits_left;
  }
  if (iVar4 == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  bs_write_ue(b,ppVar1->num_slice_groups_minus1);
  if (0 < ppVar1->num_slice_groups_minus1) {
    bs_write_ue(b,ppVar1->slice_group_map_type);
    switch(ppVar1->slice_group_map_type) {
    case 0:
      if (-1 < ppVar1->num_slice_groups_minus1) {
        lVar11 = -1;
        do {
          bs_write_ue(b,ppVar1->run_length_minus1[lVar11 + 1]);
          lVar11 = lVar11 + 1;
        } while (lVar11 < ppVar1->num_slice_groups_minus1);
      }
      break;
    case 2:
      if (0 < ppVar1->num_slice_groups_minus1) {
        lVar11 = 0;
        do {
          bs_write_ue(b,ppVar1->top_left[lVar11]);
          bs_write_ue(b,ppVar1->bottom_right[lVar11]);
          lVar11 = lVar11 + 1;
        } while (lVar11 < ppVar1->num_slice_groups_minus1);
      }
      break;
    case 3:
    case 4:
    case 5:
      uVar2 = ppVar1->slice_group_change_direction_flag;
      iVar4 = b->bits_left + -1;
      b->bits_left = iVar4;
      pbVar3 = b->p;
      if (pbVar3 < b->end) {
        *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
        *b->p = *b->p | (byte)((uVar2 & 1) << ((byte)b->bits_left & 0x1f));
        iVar4 = b->bits_left;
      }
      if (iVar4 == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
      }
      bs_write_ue(b,ppVar1->slice_group_change_rate_minus1);
      break;
    case 6:
      bs_write_ue(b,ppVar1->pic_size_in_map_units_minus1);
      iVar4 = ppVar1->pic_size_in_map_units_minus1;
      if (-1 < iVar4) {
        lVar11 = 0;
        do {
          iVar8 = ppVar1->num_slice_groups_minus1;
          if (iVar8 < 0) {
            iVar8 = -1;
          }
          uVar2 = 0xffffffff;
          do {
            uVar5 = uVar2;
            uVar2 = uVar5 + 1;
          } while (iVar8 + 1U >> ((byte)uVar2 & 0x1f) != 0);
          if (iVar8 + 1U != 1 << ((byte)uVar5 & 0x1f)) {
            uVar5 = uVar2;
          }
          if (uVar2 == 0) {
            uVar5 = 0;
          }
          if (0 < (int)uVar5) {
            uVar2 = ppVar1->slice_group_id[lVar11];
            iVar4 = b->bits_left;
            do {
              uVar5 = uVar5 - 1;
              iVar4 = iVar4 + -1;
              b->bits_left = iVar4;
              pbVar3 = b->p;
              if (pbVar3 < b->end) {
                *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
                *b->p = *b->p | ((uVar2 >> (uVar5 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
                iVar4 = b->bits_left;
              }
              if (iVar4 == 0) {
                b->p = b->p + 1;
                b->bits_left = 8;
                iVar4 = 8;
              }
            } while (uVar5 != 0);
            iVar4 = ppVar1->pic_size_in_map_units_minus1;
          }
          bVar13 = lVar11 < iVar4;
          lVar11 = lVar11 + 1;
        } while (bVar13);
      }
    }
  }
  bs_write_ue(b,ppVar1->num_ref_idx_l0_active_minus1);
  bs_write_ue(b,ppVar1->num_ref_idx_l1_active_minus1);
  uVar2 = ppVar1->weighted_pred_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar3 = b->p;
  if (pbVar3 < b->end) {
    *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | (byte)((uVar2 & 1) << ((byte)b->bits_left & 0x1f));
    iVar4 = b->bits_left;
  }
  if (iVar4 == 0) {
    b->p = b->p + 1;
    iVar4 = 8;
  }
  uVar2 = ppVar1->weighted_bipred_idc;
  uVar5 = 1;
  do {
    iVar4 = iVar4 + -1;
    b->bits_left = iVar4;
    pbVar3 = b->p;
    if (pbVar3 < b->end) {
      *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | ((uVar2 >> (uVar5 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
      iVar4 = b->bits_left;
    }
    if (iVar4 == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
      iVar4 = 8;
    }
    bVar13 = uVar5 != 0;
    uVar5 = uVar5 - 1;
  } while (bVar13);
  iVar4 = ppVar1->pic_init_qp_minus26;
  uVar7 = iVar4 * 2 - 1;
  if (iVar4 < 1) {
    uVar7 = iVar4 * -2;
  }
  bs_write_ue(b,uVar7);
  iVar4 = ppVar1->pic_init_qs_minus26;
  uVar7 = iVar4 * 2 - 1;
  if (iVar4 < 1) {
    uVar7 = iVar4 * -2;
  }
  bs_write_ue(b,uVar7);
  iVar4 = ppVar1->chroma_qp_index_offset;
  uVar7 = iVar4 * 2 - 1;
  if (iVar4 < 1) {
    uVar7 = iVar4 * -2;
  }
  bs_write_ue(b,uVar7);
  uVar2 = ppVar1->deblocking_filter_control_present_flag;
  iVar4 = b->bits_left + -1;
  b->bits_left = iVar4;
  pbVar3 = b->p;
  if (pbVar3 < b->end) {
    *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | (byte)((uVar2 & 1) << ((byte)b->bits_left & 0x1f));
    iVar4 = b->bits_left;
    pbVar3 = b->p;
  }
  if (iVar4 == 0) {
    pbVar3 = pbVar3 + 1;
    b->p = pbVar3;
    iVar4 = 8;
  }
  uVar2 = ppVar1->constrained_intra_pred_flag;
  iVar4 = iVar4 + -1;
  b->bits_left = iVar4;
  if (pbVar3 < b->end) {
    *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | (byte)((uVar2 & 1) << ((byte)b->bits_left & 0x1f));
    iVar4 = b->bits_left;
    pbVar3 = b->p;
  }
  if (iVar4 == 0) {
    pbVar3 = pbVar3 + 1;
    b->p = pbVar3;
    iVar4 = 8;
  }
  uVar2 = ppVar1->redundant_pic_cnt_present_flag;
  iVar4 = iVar4 + -1;
  b->bits_left = iVar4;
  if (pbVar3 < b->end) {
    *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
    *b->p = *b->p | (byte)((uVar2 & 1) << ((byte)b->bits_left & 0x1f));
    iVar4 = b->bits_left;
  }
  if (iVar4 == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
    iVar4 = 8;
  }
  uVar2 = ppVar1->transform_8x8_mode_flag;
  if ((ppVar1->second_chroma_qp_index_offset != 0 || ppVar1->pic_scaling_matrix_present_flag != 0)
      || uVar2 != 0) {
    iVar4 = iVar4 + -1;
    b->bits_left = iVar4;
    pbVar3 = b->p;
    if (pbVar3 < b->end) {
      *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | (byte)((uVar2 & 1) << ((byte)b->bits_left & 0x1f));
      iVar4 = b->bits_left;
      pbVar3 = b->p;
    }
    if (iVar4 == 0) {
      pbVar3 = pbVar3 + 1;
      b->p = pbVar3;
      iVar4 = 8;
    }
    uVar2 = ppVar1->pic_scaling_matrix_present_flag;
    iVar4 = iVar4 + -1;
    b->bits_left = iVar4;
    if (pbVar3 < b->end) {
      *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
      *b->p = *b->p | (byte)((uVar2 & 1) << ((byte)b->bits_left & 0x1f));
      iVar4 = b->bits_left;
    }
    if (iVar4 == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    if ((ppVar1->pic_scaling_matrix_present_flag != 0) && (-3 < ppVar1->transform_8x8_mode_flag)) {
      paiVar10 = ppVar1->ScalingList4x4;
      piVar12 = ppVar1->ScalingList8x8[1] + 0x3a;
      paiVar9 = (int (*) [16])(ppVar1->bottom_right + 6);
      uVar6 = 0xffffffffffffffff;
      do {
        uVar2 = piVar12[-0xe8];
        iVar4 = b->bits_left + -1;
        b->bits_left = iVar4;
        pbVar3 = b->p;
        if (pbVar3 < b->end) {
          *pbVar3 = *pbVar3 & ~(byte)(1 << ((byte)iVar4 & 0x1f));
          *b->p = *b->p | (byte)((uVar2 & 1) << ((byte)b->bits_left & 0x1f));
          iVar4 = b->bits_left;
        }
        if (iVar4 == 0) {
          b->p = b->p + 1;
          b->bits_left = 8;
        }
        uVar6 = uVar6 + 1;
        if (piVar12[-0xe8] != 0) {
          if (uVar6 < 6) {
            iVar4 = 0x10;
            useDefaultScalingMatrixFlag = piVar12 + -0x80;
            scalingList = paiVar10;
          }
          else {
            iVar4 = 0x40;
            useDefaultScalingMatrixFlag = piVar12;
            scalingList = paiVar9;
          }
          write_scaling_list(b,*scalingList,iVar4,useDefaultScalingMatrixFlag);
        }
        piVar12 = piVar12 + 1;
        paiVar10 = paiVar10 + 1;
        paiVar9 = paiVar9 + 4;
      } while ((long)uVar6 < (long)ppVar1->transform_8x8_mode_flag * 2 + 5);
    }
    iVar4 = ppVar1->second_chroma_qp_index_offset;
    uVar7 = iVar4 * 2 - 1;
    if (iVar4 < 1) {
      uVar7 = iVar4 * -2;
    }
    bs_write_ue(b,uVar7);
    return;
  }
  return;
}

Assistant:

void write_pic_parameter_set_rbsp(h264_stream_t* h, bs_t* b)
{
    pps_t* pps = h->pps;
    if( 0 )
    {
        memset(pps, 0, sizeof(pps_t));
    }

    bs_write_ue(b, pps->pic_parameter_set_id);
    bs_write_ue(b, pps->seq_parameter_set_id);
    bs_write_u1(b, pps->entropy_coding_mode_flag);
    bs_write_u1(b, pps->pic_order_present_flag);
    bs_write_ue(b, pps->num_slice_groups_minus1);

    if( pps->num_slice_groups_minus1 > 0 )
    {
        bs_write_ue(b, pps->slice_group_map_type);
        if( pps->slice_group_map_type == 0 )
        {
            for( int i_group = 0; i_group <= pps->num_slice_groups_minus1; i_group++ )
            {
                bs_write_ue(b, pps->run_length_minus1[ i_group ]);
            }
        }
        else if( pps->slice_group_map_type == 2 )
        {
            for( int i_group = 0; i_group < pps->num_slice_groups_minus1; i_group++ )
            {
                bs_write_ue(b, pps->top_left[ i_group ]);
                bs_write_ue(b, pps->bottom_right[ i_group ]);
            }
        }
        else if( pps->slice_group_map_type == 3 ||
                 pps->slice_group_map_type == 4 ||
                 pps->slice_group_map_type == 5 )
        {
            bs_write_u1(b, pps->slice_group_change_direction_flag);
            bs_write_ue(b, pps->slice_group_change_rate_minus1);
        }
        else if( pps->slice_group_map_type == 6 )
        {
            bs_write_ue(b, pps->pic_size_in_map_units_minus1);
            for( int i = 0; i <= pps->pic_size_in_map_units_minus1; i++ )
            {
                int v = intlog2( pps->num_slice_groups_minus1 + 1 );
                bs_write_u(b, v, pps->slice_group_id[ i ]);
            }
        }
    }
    bs_write_ue(b, pps->num_ref_idx_l0_active_minus1);
    bs_write_ue(b, pps->num_ref_idx_l1_active_minus1);
    bs_write_u1(b, pps->weighted_pred_flag);
    bs_write_u(b, 2, pps->weighted_bipred_idc);
    bs_write_se(b, pps->pic_init_qp_minus26);
    bs_write_se(b, pps->pic_init_qs_minus26);
    bs_write_se(b, pps->chroma_qp_index_offset);
    bs_write_u1(b, pps->deblocking_filter_control_present_flag);
    bs_write_u1(b, pps->constrained_intra_pred_flag);
    bs_write_u1(b, pps->redundant_pic_cnt_present_flag);

    int have_more_data = 0;
    if( 0 ) { have_more_data = more_rbsp_data(b); }
    if( 1 )
    {
        have_more_data = pps->transform_8x8_mode_flag | pps->pic_scaling_matrix_present_flag | pps->second_chroma_qp_index_offset != 0;
    }

    if( have_more_data )
    {
        bs_write_u1(b, pps->transform_8x8_mode_flag);
        bs_write_u1(b, pps->pic_scaling_matrix_present_flag);
        if( pps->pic_scaling_matrix_present_flag )
        {
            for( int i = 0; i < 6 + 2* pps->transform_8x8_mode_flag; i++ )
            {
                bs_write_u1(b, pps->pic_scaling_list_present_flag[ i ]);
                if( pps->pic_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        write_scaling_list( b, pps->ScalingList4x4[ i ], 16,
                                                 &( pps->UseDefaultScalingMatrix4x4Flag[ i ] ) );
                    }
                    else
                    {
                        write_scaling_list( b, pps->ScalingList8x8[ i - 6 ], 64,
                                                 &( pps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] ) );
                    }
                }
            }
        }
        bs_write_se(b, pps->second_chroma_qp_index_offset);
    }

    if( 0 )
    {
        memcpy(h->pps_table[pps->pic_parameter_set_id], h->pps, sizeof(pps_t));
    }
}